

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_visual.cxx
# Opt level: O3

int Fl::visual(int flags)

{
  int iVar1;
  XVisualInfo *pXVar2;
  int iVar3;
  long lVar4;
  XVisualInfo *pXVar5;
  XVisualInfo *v;
  int num;
  XVisualInfo vTemplate;
  int local_74;
  undefined1 local_70 [64];
  
  fl_open_display();
  iVar1 = test_visual(fl_visual,flags);
  iVar3 = 1;
  if (iVar1 == 0) {
    iVar3 = 0;
    pXVar2 = (XVisualInfo *)XGetVisualInfo(fl_display,0,local_70,&local_74);
    if (0 < local_74) {
      lVar4 = 0;
      pXVar5 = (XVisualInfo *)0x0;
      v = pXVar2;
      do {
        iVar1 = test_visual(v,flags);
        if ((iVar1 != 0) && ((pXVar5 == (XVisualInfo *)0x0 || (pXVar5->depth < v->depth)))) {
          pXVar5 = v;
        }
        lVar4 = lVar4 + 1;
        v = v + 1;
      } while (lVar4 < local_74);
      if (pXVar5 != (XVisualInfo *)0x0) {
        fl_visual = pXVar5;
        fl_colormap = XCreateColormap(fl_display,
                                      *(undefined8 *)
                                       (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80
                                       ),pXVar5->visual,0);
        return 1;
      }
    }
    XFree(pXVar2);
  }
  return iVar3;
}

Assistant:

int Fl::visual(int flags) {
#if USE_XDBE == 0
  if (flags & FL_DOUBLE) return 0;
#endif
  fl_open_display();
  // always use default if possible:
  if (test_visual(*fl_visual, flags)) return 1;
  // get all the visuals:
  XVisualInfo vTemplate;
  int num;
  XVisualInfo *visualList = XGetVisualInfo(fl_display, 0, &vTemplate, &num);
  // find all matches, use the one with greatest depth:
  XVisualInfo *found = 0;
  for (int i=0; i<num; i++) if (test_visual(visualList[i], flags)) {
    if (!found || found->depth < visualList[i].depth)
      found = &visualList[i];
  }
  if (!found) {XFree((void*)visualList); return 0;}
  fl_visual = found;
  fl_colormap = XCreateColormap(fl_display, RootWindow(fl_display,fl_screen),
				fl_visual->visual, AllocNone);
  return 1;
}